

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,char *s)

{
  allocator<char> local_69;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_68;
  string local_50 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).buffer_.
  ptr = (void *)0x0;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001437a8;
  std::__cxx11::string::string<std::allocator<char>>(local_50,s,&local_69);
  std::__cxx11::string::string((string *)&local_30,local_50);
  Matcher<std::basic_string_view<char,std::char_traits<char>>const&>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>const&> *)&local_68,
             &local_30);
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::operator=
            (&this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
             ,&local_68);
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MatcherBase
            (&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}